

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

_Bool golf_level_save(golf_level_t *level,char *path)

{
  int iVar1;
  JSON_Value *value;
  JSON_Array *pJVar2;
  golf_material_t *pgVar3;
  JSON_Value *pJVar4;
  JSON_Object *pJVar5;
  golf_lightmap_image_t *pgVar6;
  JSON_Value *pJVar7;
  JSON_Value *pJVar8;
  JSON_Array *arr;
  golf_entity_t *entity_00;
  golf_geo_t *geo_00;
  golf_transform_t *transform_00;
  golf_lightmap_section_t *lightmap_section_00;
  golf_movement_t *movement_00;
  JSON_Value *value_00;
  JSON_Object *json_obj;
  JSON_Value *json_val;
  int i_4;
  JSON_Array *json_data_dependencies_arr;
  JSON_Value *json_data_dependencies_val;
  golf_movement_t *movement;
  golf_lightmap_section_t *lightmap_section;
  golf_transform_t *transform;
  golf_geo_t *geo;
  golf_model_entity_t *model;
  int parent_idx;
  JSON_Object *json_entity_obj;
  JSON_Value *json_entity_val;
  golf_entity_t *entity;
  int i_3;
  JSON_Array *json_entities_arr;
  JSON_Value *json_entities_val;
  int i_2;
  int saved_idx;
  vec_int_t entity_saved_idx;
  vec_char_t png_data;
  int s;
  JSON_Array *datas_arr;
  JSON_Value *datas_val;
  JSON_Object *json_lightmap_image_obj;
  JSON_Value *json_lightmap_image_val;
  golf_lightmap_image_t *lightmap_image;
  int i_1;
  JSON_Array *json_lightmap_images_arr;
  JSON_Value *json_lightmap_images_val;
  JSON_Object *json_material_obj;
  JSON_Value *json_material_val;
  golf_material_t *material;
  int i;
  JSON_Array *json_materials_arr;
  JSON_Value *json_materials_val;
  vec_str_t data_dependencies;
  char *path_local;
  golf_level_t *level_local;
  
  data_dependencies.alloc_category = path;
  memset(&json_materials_val,0,0x18);
  data_dependencies._8_8_ = (long)"data/levels/level-1.level" + 0x14;
  _add_dependency((vec_str_t *)&json_materials_val,"data/textures/hole_lightmap.png");
  value = json_value_init_array();
  pJVar2 = json_value_get_array(value);
  for (material._4_4_ = 0; material._4_4_ < (level->materials).length;
      material._4_4_ = material._4_4_ + 1) {
    pgVar3 = (level->materials).data + material._4_4_;
    if ((pgVar3->active & 1U) != 0) {
      pJVar4 = json_value_init_object();
      pJVar5 = json_value_get_object(pJVar4);
      json_object_set_string(pJVar5,"name",pgVar3->name);
      json_object_set_number(pJVar5,"friction",(double)pgVar3->friction);
      json_object_set_number(pJVar5,"restitution",(double)pgVar3->restitution);
      json_object_set_number(pJVar5,"vel_scale",(double)pgVar3->vel_scale);
      switch(pgVar3->type) {
      case GOLF_MATERIAL_TEXTURE:
        json_object_set_string(pJVar5,"type","texture");
        json_object_set_string(pJVar5,"texture",(char *)&pgVar3->field_6);
        _add_dependency((vec_str_t *)&json_materials_val,(char *)&pgVar3->field_6);
        break;
      case GOLF_MATERIAL_COLOR:
        json_object_set_string(pJVar5,"type","color");
        golf_json_object_set_vec4(pJVar5,"color",(pgVar3->field_6).color);
        break;
      case GOLF_MATERIAL_DIFFUSE_COLOR:
        json_object_set_string(pJVar5,"type","diffuse_color");
        golf_json_object_set_vec4(pJVar5,"color",(pgVar3->field_6).color);
        break;
      case GOLF_MATERIAL_ENVIRONMENT:
        json_object_set_string(pJVar5,"type","environment");
        json_object_set_string(pJVar5,"texture",(char *)&pgVar3->field_6);
        _add_dependency((vec_str_t *)&json_materials_val,(char *)&pgVar3->field_6);
      }
      json_array_append_value(pJVar2,pJVar4);
    }
  }
  pJVar4 = json_value_init_array();
  pJVar2 = json_value_get_array(pJVar4);
  for (lightmap_image._4_4_ = 0; lightmap_image._4_4_ < (level->lightmap_images).length;
      lightmap_image._4_4_ = lightmap_image._4_4_ + 1) {
    pgVar6 = (level->lightmap_images).data + lightmap_image._4_4_;
    if ((pgVar6->active & 1U) != 0) {
      pJVar7 = json_value_init_object();
      pJVar5 = json_value_get_object(pJVar7);
      json_object_set_string(pJVar5,"name",pgVar6->name);
      json_object_set_number(pJVar5,"resolution",(double)pgVar6->resolution);
      json_object_set_number(pJVar5,"time_length",(double)pgVar6->time_length);
      json_object_set_number(pJVar5,"num_samples",(double)pgVar6->num_samples);
      json_object_set_boolean(pJVar5,"repeats",(uint)(pgVar6->repeats & 1));
      pJVar8 = json_value_init_array();
      arr = json_value_get_array(pJVar8);
      for (png_data.alloc_category._4_4_ = 0; png_data.alloc_category._4_4_ < pgVar6->num_samples;
          png_data.alloc_category._4_4_ = png_data.alloc_category._4_4_ + 1) {
        memset(&entity_saved_idx.alloc_category,0,0x18);
        stbi_write_png_to_func
                  (_stbi_write_func,&entity_saved_idx.alloc_category,pgVar6->width,pgVar6->height,1,
                   pgVar6->data[png_data.alloc_category._4_4_],pgVar6->width);
        golf_json_array_append_data(arr,(uchar *)entity_saved_idx.alloc_category,(int)png_data.data)
        ;
        golf_free_tracked(entity_saved_idx.alloc_category);
      }
      json_object_set_value(pJVar5,"datas",pJVar8);
      json_array_append_value(pJVar2,pJVar7);
    }
  }
  memset(&i_2,0,0x18);
  entity_saved_idx._8_8_ = (long)"data/levels/level-1.level" + 0x14;
  json_entities_val._4_4_ = 0;
  for (json_entities_val._0_4_ = 0; (int)json_entities_val < (level->entities).length;
      json_entities_val._0_4_ = (int)json_entities_val + 1) {
    iVar1 = vec_expand_((char **)&i_2,(int *)&entity_saved_idx,
                        (int *)((long)&entity_saved_idx.data + 4),4,(char *)entity_saved_idx._8_8_);
    if (iVar1 == 0) {
      *(int *)(_i_2 + (long)(int)entity_saved_idx.data * 4) = json_entities_val._4_4_;
      entity_saved_idx.data._0_4_ = (int)entity_saved_idx.data + 1;
    }
    if (((level->entities).data[(int)json_entities_val].active & 1U) != 0) {
      json_entities_val._4_4_ = json_entities_val._4_4_ + 1;
    }
  }
  pJVar7 = json_value_init_array();
  pJVar2 = json_value_get_array(pJVar7);
  for (entity._4_4_ = 0; entity._4_4_ < (level->entities).length; entity._4_4_ = entity._4_4_ + 1) {
    entity_00 = (level->entities).data + entity._4_4_;
    if ((entity_00->active & 1U) != 0) {
      pJVar8 = json_value_init_object();
      pJVar5 = json_value_get_object(pJVar8);
      model._4_4_ = entity_00->parent_idx;
      if (-1 < model._4_4_) {
        model._4_4_ = *(int *)(_i_2 + (long)model._4_4_ * 4);
      }
      json_object_set_number(pJVar5,"parent_idx",(double)model._4_4_);
      json_object_set_string(pJVar5,"name",entity_00->name);
      switch(entity_00->type) {
      case MODEL_ENTITY:
        json_object_set_string(pJVar5,"type","model");
        json_object_set_string(pJVar5,"model",(entity_00->field_4).model.model_path);
        json_object_set_number(pJVar5,"uv_scale",(double)(entity_00->field_4).model.uv_scale);
        json_object_set_boolean
                  (pJVar5,"ignore_physics",(uint)((entity_00->field_4).model.ignore_physics & 1));
        _add_dependency((vec_str_t *)&json_materials_val,(entity_00->field_4).model.model_path);
        break;
      case BALL_START_ENTITY:
        json_object_set_string(pJVar5,"type","ball-start");
        break;
      case HOLE_ENTITY:
        json_object_set_string(pJVar5,"type","hole");
        break;
      case GEO_ENTITY:
        json_object_set_string(pJVar5,"type","geo");
        break;
      case WATER_ENTITY:
        json_object_set_string(pJVar5,"type","water");
        break;
      case GROUP_ENTITY:
        json_object_set_string(pJVar5,"type","group");
        break;
      case BEGIN_ANIMATION_ENTITY:
        json_object_set_string(pJVar5,"type","begin_animation");
        break;
      case CAMERA_ZONE_ENTITY:
        json_object_set_string(pJVar5,"type","camera_zone");
        json_object_set_boolean
                  (pJVar5,"towards_hole",
                   (uint)((entity_00->field_4).geo.lightmap_section.lightmap_name[0] & 1));
      }
      geo_00 = golf_entity_get_geo(entity_00);
      if (geo_00 != (golf_geo_t *)0x0) {
        _golf_json_object_set_geo(pJVar5,"geo",geo_00);
      }
      transform_00 = golf_entity_get_transform(entity_00);
      if (transform_00 != (golf_transform_t *)0x0) {
        _golf_json_object_set_transform(pJVar5,"transform",transform_00);
      }
      lightmap_section_00 = golf_entity_get_lightmap_section(entity_00);
      if (lightmap_section_00 != (golf_lightmap_section_t *)0x0) {
        _golf_json_object_set_lightmap_section(pJVar5,"lightmap_section",lightmap_section_00);
      }
      movement_00 = golf_entity_get_movement(entity_00);
      if (movement_00 != (golf_movement_t *)0x0) {
        _golf_json_object_set_movement(pJVar5,"movement",movement_00);
      }
      json_array_append_value(pJVar2,pJVar8);
    }
  }
  golf_free_tracked(_i_2);
  pJVar8 = json_value_init_array();
  pJVar2 = json_value_get_array(pJVar8);
  for (json_val._4_4_ = 0; json_val._4_4_ < (int)data_dependencies.data;
      json_val._4_4_ = json_val._4_4_ + 1) {
    json_array_append_string(pJVar2,(char *)(&json_materials_val->parent)[json_val._4_4_]);
  }
  golf_free_tracked(json_materials_val);
  value_00 = json_value_init_object();
  pJVar5 = json_value_get_object(value_00);
  json_object_set_value(pJVar5,"data_dependencies",pJVar8);
  json_object_set_value(pJVar5,"materials",value);
  json_object_set_value(pJVar5,"lightmap_images",pJVar4);
  json_object_set_value(pJVar5,"entities",pJVar7);
  json_serialize_to_file_pretty(value_00,data_dependencies.alloc_category);
  json_value_free(value_00);
  return true;
}

Assistant:

bool golf_level_save(golf_level_t *level, const char *path) {
    vec_str_t data_dependencies;
    vec_init(&data_dependencies, "level");
    _add_dependency(&data_dependencies, "data/textures/hole_lightmap.png");

    JSON_Value *json_materials_val = json_value_init_array();
    JSON_Array *json_materials_arr = json_value_get_array(json_materials_val);
    for (int i = 0; i < level->materials.length; i++) {
        golf_material_t *material = &level->materials.data[i];
        if (!material->active) continue;

        JSON_Value *json_material_val = json_value_init_object();
        JSON_Object *json_material_obj = json_value_get_object(json_material_val);
        json_object_set_string(json_material_obj, "name", material->name);
        json_object_set_number(json_material_obj, "friction", material->friction);
        json_object_set_number(json_material_obj, "restitution", material->restitution);
        json_object_set_number(json_material_obj, "vel_scale", material->vel_scale);

        switch (material->type) {
            case GOLF_MATERIAL_TEXTURE: {
                json_object_set_string(json_material_obj, "type", "texture");
                json_object_set_string(json_material_obj, "texture", material->texture_path);
                _add_dependency(&data_dependencies, material->texture_path);
                break;
            }
            case GOLF_MATERIAL_COLOR: {
                json_object_set_string(json_material_obj, "type", "color");
                golf_json_object_set_vec4(json_material_obj, "color", material->color);
                break;
            }
            case GOLF_MATERIAL_DIFFUSE_COLOR: {
                json_object_set_string(json_material_obj, "type", "diffuse_color");
                golf_json_object_set_vec4(json_material_obj, "color", material->color);
                break;
            }
            case GOLF_MATERIAL_ENVIRONMENT: {
                json_object_set_string(json_material_obj, "type", "environment");
                json_object_set_string(json_material_obj, "texture", material->texture_path);
                _add_dependency(&data_dependencies, material->texture_path);
                break;
            }
        }

        json_array_append_value(json_materials_arr, json_material_val);
    }

    JSON_Value *json_lightmap_images_val = json_value_init_array();
    JSON_Array *json_lightmap_images_arr = json_value_get_array(json_lightmap_images_val);
    for (int i = 0; i < level->lightmap_images.length; i++) {
        golf_lightmap_image_t *lightmap_image = &level->lightmap_images.data[i];
        if (!lightmap_image->active) continue;

        JSON_Value *json_lightmap_image_val = json_value_init_object();
        JSON_Object *json_lightmap_image_obj = json_value_get_object(json_lightmap_image_val);
        json_object_set_string(json_lightmap_image_obj, "name", lightmap_image->name);
        json_object_set_number(json_lightmap_image_obj, "resolution", lightmap_image->resolution);
        json_object_set_number(json_lightmap_image_obj, "time_length", lightmap_image->time_length);
        json_object_set_number(json_lightmap_image_obj, "num_samples", lightmap_image->num_samples);
        json_object_set_boolean(json_lightmap_image_obj, "repeats", lightmap_image->repeats);

        JSON_Value *datas_val = json_value_init_array();
        JSON_Array *datas_arr = json_value_get_array(datas_val);
        for (int s = 0; s < lightmap_image->num_samples; s++) {
            vec_char_t png_data;
            vec_init(&png_data, "level");
            stbi_write_png_to_func(_stbi_write_func, &png_data, lightmap_image->width, lightmap_image->height, 1, lightmap_image->data[s], lightmap_image->width);
            golf_json_array_append_data(datas_arr, (unsigned char*)png_data.data, sizeof(unsigned char) * png_data.length);
            vec_deinit(&png_data);
        }
        json_object_set_value(json_lightmap_image_obj, "datas", datas_val);

        json_array_append_value(json_lightmap_images_arr, json_lightmap_image_val);
    }

    vec_int_t entity_saved_idx;
    vec_init(&entity_saved_idx, "level");
    {
        int saved_idx = 0;
        for (int i = 0; i < level->entities.length; i++) {
            vec_push(&entity_saved_idx, saved_idx);
            if (level->entities.data[i].active) saved_idx++;
        }
    }

    JSON_Value *json_entities_val = json_value_init_array();
    JSON_Array *json_entities_arr = json_value_get_array(json_entities_val);
    for (int i = 0; i < level->entities.length; i++) {
        golf_entity_t *entity = &level->entities.data[i];
        if (!entity->active) continue;

        JSON_Value *json_entity_val = json_value_init_object();
        JSON_Object *json_entity_obj = json_value_get_object(json_entity_val);

        int parent_idx = entity->parent_idx;
        if (parent_idx >= 0) {
            parent_idx = entity_saved_idx.data[parent_idx];
        }
        json_object_set_number(json_entity_obj, "parent_idx", parent_idx);
        json_object_set_string(json_entity_obj, "name", entity->name);
        switch (entity->type) {
            case MODEL_ENTITY: {
                golf_model_entity_t *model = &entity->model;
                json_object_set_string(json_entity_obj, "type", "model");
                json_object_set_string(json_entity_obj, "model", model->model_path);
                json_object_set_number(json_entity_obj, "uv_scale", model->uv_scale);
                json_object_set_boolean(json_entity_obj, "ignore_physics", model->ignore_physics);
                _add_dependency(&data_dependencies, model->model_path);
                break;
            }
            case BALL_START_ENTITY: {
                json_object_set_string(json_entity_obj, "type", "ball-start");
                break;
            }
            case HOLE_ENTITY: {
                json_object_set_string(json_entity_obj, "type", "hole");
                break;
            }
            case GEO_ENTITY: {
                json_object_set_string(json_entity_obj, "type", "geo");
                break;
            }
            case GROUP_ENTITY: {
                json_object_set_string(json_entity_obj, "type", "group");
                break;
            }
            case WATER_ENTITY: {
                json_object_set_string(json_entity_obj, "type", "water");
                break;
            }
            case BEGIN_ANIMATION_ENTITY: {
                json_object_set_string(json_entity_obj, "type", "begin_animation");
                break;
            }
            case CAMERA_ZONE_ENTITY: {
                json_object_set_string(json_entity_obj, "type", "camera_zone");
                json_object_set_boolean(json_entity_obj, "towards_hole", entity->camera_zone.towards_hole);
                break;
            }
        }

        golf_geo_t *geo = golf_entity_get_geo(entity);
        if (geo) {
            _golf_json_object_set_geo(json_entity_obj, "geo", geo);
        }

        golf_transform_t *transform = golf_entity_get_transform(entity);
        if (transform) {
            _golf_json_object_set_transform(json_entity_obj, "transform", transform);
        }

        golf_lightmap_section_t *lightmap_section = golf_entity_get_lightmap_section(entity);
        if (lightmap_section) {
            _golf_json_object_set_lightmap_section(json_entity_obj, "lightmap_section", lightmap_section);
        }

        golf_movement_t *movement = golf_entity_get_movement(entity);
        if (movement) {
            _golf_json_object_set_movement(json_entity_obj, "movement", movement);
        }

        json_array_append_value(json_entities_arr, json_entity_val);
    }

    vec_deinit(&entity_saved_idx);

    JSON_Value *json_data_dependencies_val = json_value_init_array();
    JSON_Array *json_data_dependencies_arr = json_value_get_array(json_data_dependencies_val);
    for (int i = 0; i < data_dependencies.length; i++) {
        json_array_append_string(json_data_dependencies_arr, data_dependencies.data[i]);
    }
    vec_deinit(&data_dependencies);

    JSON_Value *json_val = json_value_init_object();
    JSON_Object *json_obj = json_value_get_object(json_val);
    json_object_set_value(json_obj, "data_dependencies", json_data_dependencies_val);
    json_object_set_value(json_obj, "materials", json_materials_val);
    json_object_set_value(json_obj, "lightmap_images", json_lightmap_images_val);
    json_object_set_value(json_obj, "entities", json_entities_val);
    json_serialize_to_file_pretty(json_val, path);
    json_value_free(json_val);
    return true;
}